

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O0

bool __thiscall
cmGlobalGhsMultiGenerator::SetGeneratorPlatform
          (cmGlobalGhsMultiGenerator *this,string *p,cmMakefile *mf)

{
  cmValue cVar1;
  bool bVar2;
  string_view sVar3;
  allocator<char> local_111;
  string local_110;
  char local_e9;
  undefined1 local_e8 [8];
  string tgt;
  string local_c0;
  cmValue local_a0;
  cmValue platform;
  allocator<char> local_81;
  undefined1 local_80 [8];
  string arch;
  allocator<char> local_49;
  string local_48;
  cmValue local_28;
  cmValue t;
  cmMakefile *mf_local;
  string *p_local;
  cmGlobalGhsMultiGenerator *this_local;
  
  t.Value = (string *)mf;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"GHS_PRIMARY_TARGET",&local_49);
  local_28 = cmMakefile::GetDefinition(mf,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  bVar2 = cmValue::IsOff(&local_28);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_80,"arm",&local_81);
    std::allocator<char>::~allocator(&local_81);
    sVar3 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)p);
    platform.Value = (string *)sVar3._M_len;
    bVar2 = cmIsOff(sVar3);
    if (!bVar2) {
      std::__cxx11::string::operator=((string *)local_80,(string *)p);
    }
    cVar1.Value = t.Value;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"GHS_TARGET_PLATFORM",
               (allocator<char> *)(tgt.field_2._M_local_buf + 0xf));
    local_a0 = cmMakefile::GetDefinition(cVar1.Value,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator((allocator<char> *)(tgt.field_2._M_local_buf + 0xf));
    local_e9 = '_';
    cmStrCat<std::__cxx11::string&,char,cmValue&,char_const(&)[5]>
              ((string *)local_e8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
               &local_e9,&local_a0,(char (*) [5])".tgt");
    cVar1 = t;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_110,"GHS_PRIMARY_TARGET",&local_111);
    sVar3 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_e8);
    cmMakefile::AddDefinition((cmMakefile *)cVar1.Value,&local_110,sVar3);
    std::__cxx11::string::~string((string *)&local_110);
    std::allocator<char>::~allocator(&local_111);
    std::__cxx11::string::~string((string *)local_e8);
    std::__cxx11::string::~string((string *)local_80);
  }
  return true;
}

Assistant:

bool cmGlobalGhsMultiGenerator::SetGeneratorPlatform(std::string const& p,
                                                     cmMakefile* mf)
{
  /* set primary target */
  cmValue t = mf->GetDefinition("GHS_PRIMARY_TARGET");
  if (t.IsOff()) {
    /* Use the value from `-A` or use `arm` */
    std::string arch = "arm";
    if (!cmIsOff(p)) {
      arch = p;
    }
    cmValue platform = mf->GetDefinition("GHS_TARGET_PLATFORM");
    std::string tgt = cmStrCat(arch, '_', platform, ".tgt");

    /* update the primary target name*/
    mf->AddDefinition("GHS_PRIMARY_TARGET", tgt);
  }
  return true;
}